

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawListFlags *pIVar2;
  ImGuiNavMoveResult *pIVar3;
  bool *pbVar4;
  ImGuiNextWindowData *pIVar5;
  float *pfVar6;
  ImVec2 *pIVar7;
  ImGuiID IVar8;
  ImGuiInputSource IVar9;
  ImGuiID IVar10;
  ImGuiContextHook *pIVar11;
  ImFontAtlas *pIVar12;
  ImGuiPlatformMonitor *pIVar13;
  uint *puVar14;
  _func_bool_ImGuiViewport_ptr *p_Var15;
  ImGuiWindow **ppIVar16;
  ImGuiViewport **ppIVar17;
  _func_float_ImGuiViewport_ptr *p_Var18;
  _func_void_ImGuiViewport_ptr *p_Var19;
  ImGuiPopupData *pIVar20;
  undefined1 auVar21 [16];
  ImGuiContext *ctx;
  ImGuiContext *pIVar22;
  ImGuiContext *pIVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  ImGuiContext *g_4;
  uint *__dest;
  ImGuiViewport **ppIVar27;
  ImGuiViewportP *pIVar28;
  ImGuiWindow *pIVar29;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int i;
  uint uVar30;
  ImGuiViewportP *pIVar31;
  ImGuiWindow *window;
  char *pcVar32;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar33;
  ImGuiContext *g;
  int iVar34;
  ulong uVar35;
  ImRect *pIVar36;
  ImGuiViewportP **ppIVar37;
  float *pfVar38;
  ImGuiNavLayer IVar39;
  ImFont *font;
  float *pfVar40;
  ImGuiContext *g_1;
  ImGuiContext *g_3;
  ImGuiNavMoveResult *pIVar41;
  ImGuiContext *g_6;
  long lVar42;
  ImGuiWindow *old_nav_window;
  long lVar43;
  ImGuiViewportP *pIVar44;
  ImGuiContext *pIVar45;
  ulong uVar46;
  bool bVar47;
  byte bVar48;
  uint uVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  ImVec2 IVar53;
  ImVec2 IVar54;
  ImVec2 IVar55;
  double dVar56;
  ImVec2 IVar57;
  ImVec2 IVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  ImVec2 main_viewport_pos;
  ImRect local_68;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ulong local_38;
  
  ctx = GImGui;
  bVar48 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf57,"void ImGui::NewFrame()");
  }
  if (0 < (GImGui->Hooks).Size) {
    lVar42 = 0;
    lVar43 = 0;
    do {
      pIVar11 = (ctx->Hooks).Data;
      if (*(int *)(pIVar11 + lVar42) == 0) {
        (**(code **)(pIVar11 + lVar42 + 8))(ctx,pIVar11 + lVar42);
      }
      lVar43 = lVar43 + 1;
      lVar42 = lVar42 + 0x18;
    } while (lVar43 < (ctx->Hooks).Size);
  }
  ctx->ConfigFlagsLastFrame = ctx->ConfigFlagsCurrFrame;
  pIVar22 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar34 = GImGui->FrameCount;
  if ((iVar34 != 0) && (GImGui->FrameCountEnded != iVar34)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar12 = (GImGui->IO).Fonts;
  if ((pIVar12->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar12->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d90,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d91,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d92,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar50 = (GImGui->Style).Alpha;
  if ((fVar50 < 0.0) || (1.0 < fVar50)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d93,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d94,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar42 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar42] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1d97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x16);
  uVar30 = (GImGui->IO).ConfigFlags;
  if (((uVar30 & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d9b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (((uVar30 & 0x40) != 0 && iVar34 == 1) && ((pIVar22->ConfigFlagsLastFrame & 0x40) == 0)) {
    __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1da3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((uVar30 >> 10 & 1) != 0 && iVar34 == 1) && ((pIVar22->ConfigFlagsLastFrame & 0x400) == 0)) {
    __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1da5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((uVar30 >> 10 & 1) == 0) {
LAB_0012522d:
    ctx->ConfigFlagsCurrFrame = (ctx->IO).ConfigFlags;
    if (pIVar22->SettingsLoaded == false) {
      if ((pIVar22->SettingsWindows).Buf.Size != 0) {
        __assert_fail("g.SettingsWindows.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x297c,"void ImGui::UpdateSettings()");
      }
      pcVar32 = (pIVar22->IO).IniFilename;
      if (pcVar32 != (char *)0x0) {
        LoadIniSettingsFromDisk(pcVar32);
      }
      pIVar22->SettingsLoaded = true;
    }
    if ((0.0 < pIVar22->SettingsDirtyTimer) &&
       (fVar50 = pIVar22->SettingsDirtyTimer - (pIVar22->IO).DeltaTime,
       pIVar22->SettingsDirtyTimer = fVar50, fVar50 <= 0.0)) {
      pcVar32 = (pIVar22->IO).IniFilename;
      if (pcVar32 == (char *)0x0) {
        (pIVar22->IO).WantSaveIniSettings = true;
      }
      else {
        SaveIniSettingsToDisk(pcVar32);
      }
      pIVar22->SettingsDirtyTimer = 0.0;
    }
    ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
    ctx->WithinFrameScope = true;
    ctx->FrameCount = ctx->FrameCount + 1;
    pIVar44 = (ImGuiViewportP *)0x0;
    ctx->TooltipOverrideCount = 0;
    ctx->WindowsActiveCount = 0;
    iVar34 = (ctx->MenusIdSubmittedThisFrame).Capacity;
    if (iVar34 < 0) {
      uVar30 = iVar34 / 2 + iVar34;
      if (0 < (int)uVar30) {
        pIVar44 = (ImGuiViewportP *)(ulong)uVar30;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)pIVar44 * 4,GImAllocatorUserData);
      puVar14 = (ctx->MenusIdSubmittedThisFrame).Data;
      if (puVar14 != (uint *)0x0) {
        memcpy(__dest,puVar14,(long)(ctx->MenusIdSubmittedThisFrame).Size << 2);
        puVar14 = (ctx->MenusIdSubmittedThisFrame).Data;
        if ((puVar14 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar14,GImAllocatorUserData);
      }
      (ctx->MenusIdSubmittedThisFrame).Data = __dest;
      (ctx->MenusIdSubmittedThisFrame).Capacity = (int)pIVar44;
    }
    (ctx->MenusIdSubmittedThisFrame).Size = 0;
    fVar50 = (ctx->IO).DeltaTime;
    iVar34 = ctx->FramerateSecPerFrameIdx;
    ctx->FramerateSecPerFrameAccum =
         (fVar50 - ctx->FramerateSecPerFrame[iVar34]) + ctx->FramerateSecPerFrameAccum;
    ctx->FramerateSecPerFrame[iVar34] = fVar50;
    iVar26 = iVar34 + (int)((ulong)((long)(iVar34 + 1) * -0x77777777) >> 0x20) + 1;
    ctx->FramerateSecPerFrameIdx = iVar34 + 1 + ((iVar26 >> 6) - (iVar26 >> 0x1f)) * -0x78;
    uVar30 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
    (ctx->IO).Framerate =
         (float)(~uVar30 & 0x7f7fffff |
                (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / 120.0)) & uVar30);
    pIVar22 = GImGui;
    iVar34 = (GImGui->Viewports).Size;
    if (iVar34 < (GImGui->PlatformIO).Viewports.Size) {
      __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2b74,"void ImGui::UpdateViewportsNewFrame()");
    }
    uVar30 = GImGui->ConfigFlagsCurrFrame;
    if (0 < iVar34 && (uVar30 >> 10 & 1) != 0) {
      pIVar44 = (ImGuiViewportP *)0x0;
      do {
        p_Var15 = (pIVar22->PlatformIO).Platform_GetWindowMinimized;
        if ((p_Var15 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
           (pIVar28 = (pIVar22->Viewports).Data[(long)pIVar44],
           pIVar28->PlatformWindowCreated == true)) {
          bVar24 = (*p_Var15)(&pIVar28->super_ImGuiViewport);
          (pIVar28->super_ImGuiViewport).Flags =
               (uint)bVar24 << 7 | (pIVar28->super_ImGuiViewport).Flags & 0xffffff7fU;
        }
        pIVar44 = (ImGuiViewportP *)((long)&(pIVar44->super_ImGuiViewport).ID + 1);
      } while ((long)pIVar44 < (long)(pIVar22->Viewports).Size);
    }
    if (0 < (pIVar22->Viewports).Size) {
      pIVar28 = *(pIVar22->Viewports).Data;
      if ((pIVar28->super_ImGuiViewport).ID != 0x11111111) {
        __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2b8c,"void ImGui::UpdateViewportsNewFrame()");
      }
      if (pIVar28->Window != (ImGuiWindow *)0x0) {
        __assert_fail("main_viewport->Window == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2b8d,"void ImGui::UpdateViewportsNewFrame()");
      }
      if ((uVar30 >> 10 & 1) == 0) {
        local_68.Min.x = 0.0;
        local_68.Min.y = 0.0;
      }
      else {
        local_68.Min = (*(pIVar22->PlatformIO).Platform_GetWindowPos)(&pIVar28->super_ImGuiViewport)
        ;
      }
      local_40 = (pIVar22->IO).DisplaySize;
      if (((uVar30 >> 10 & 1) != 0) && (((pIVar28->super_ImGuiViewport).Flags & 0x80) != 0)) {
        local_68.Min = (pIVar28->super_ImGuiViewport).Pos;
        local_40 = (pIVar28->super_ImGuiViewport).Size;
      }
      local_58._0_8_ = pIVar28;
      uVar35 = 0;
      AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_68.Min,&local_40,0x200);
      pIVar22->CurrentDpiScale = 0.0;
      pIVar22->CurrentViewport = (ImGuiViewportP *)0x0;
      pIVar22->MouseViewport = (ImGuiViewportP *)0x0;
      iVar34 = (pIVar22->Viewports).Size;
      if (0 < iVar34) {
        do {
          iVar26 = (int)uVar35;
          if (iVar26 < 0) goto LAB_00128818;
          ppIVar37 = (pIVar22->Viewports).Data;
          pIVar44 = ppIVar37[uVar35];
          *(int *)&(pIVar44->super_ImGuiViewport).field_0x64 = iVar26;
          if ((iVar26 == 0) || (pIVar22->FrameCount + -2 <= pIVar44->LastFrameActive)) {
            bVar24 = pIVar44->PlatformWindowCreated;
            if (((uVar30 >> 10 & 1) != 0) &&
               ((((pIVar44->super_ImGuiViewport).Flags & 0x80) == 0 & bVar24) == 1)) {
              if ((pIVar44->super_ImGuiViewport).PlatformRequestMove == true) {
                IVar53 = (*(pIVar22->PlatformIO).Platform_GetWindowPos)
                                   (&pIVar44->super_ImGuiViewport);
                pIVar44->LastPlatformPos = IVar53;
                (pIVar44->super_ImGuiViewport).Pos = IVar53;
              }
              if ((pIVar44->super_ImGuiViewport).PlatformRequestResize == true) {
                IVar53 = (*(pIVar22->PlatformIO).Platform_GetWindowSize)
                                   (&pIVar44->super_ImGuiViewport);
                pIVar44->LastPlatformSize = IVar53;
                (pIVar44->super_ImGuiViewport).Size = IVar53;
              }
            }
            UpdateViewportPlatformMonitor(pIVar44);
            IVar53 = pIVar44->CurrWorkOffsetMax;
            (pIVar44->super_ImGuiViewport).WorkOffsetMin = pIVar44->CurrWorkOffsetMin;
            (pIVar44->super_ImGuiViewport).WorkOffsetMax = IVar53;
            (pIVar44->CurrWorkOffsetMin).x = 0.0;
            (pIVar44->CurrWorkOffsetMin).y = 0.0;
            (pIVar44->CurrWorkOffsetMax).x = 0.0;
            (pIVar44->CurrWorkOffsetMax).y = 0.0;
            pIVar44->Alpha = 1.0;
            if ((((pIVar44->super_ImGuiViewport).Flags & 0x200) != 0) &&
               ((((fVar50 = (pIVar44->super_ImGuiViewport).Pos.x - (pIVar44->LastPos).x,
                  fVar50 != 0.0 || (NAN(fVar50))) ||
                 (fVar50 = (pIVar44->super_ImGuiViewport).Pos.y - (pIVar44->LastPos).y,
                 fVar50 != 0.0)) || (NAN(fVar50))))) {
              TranslateWindowsInViewport
                        (pIVar44,&pIVar44->LastPos,&(pIVar44->super_ImGuiViewport).Pos);
            }
            p_Var18 = (pIVar22->PlatformIO).Platform_GetWindowDpiScale;
            if ((p_Var18 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar24 == false)) {
              uVar49 = (uint)pIVar44->PlatformMonitor;
              if (uVar49 == 0xffffffff) {
                fVar50 = (pIVar44->super_ImGuiViewport).DpiScale;
                uVar49 = -(uint)(fVar50 != 0.0);
                fVar50 = (float)(~uVar49 & 0x3f800000 | (uint)fVar50 & uVar49);
              }
              else {
                if ((pIVar44->PlatformMonitor < 0) ||
                   ((pIVar22->PlatformIO).Monitors.Size <= (int)uVar49)) {
                  pcVar32 = 
                  "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]";
                  goto LAB_0012882d;
                }
                fVar50 = (pIVar22->PlatformIO).Monitors.Data[uVar49].DpiScale;
              }
            }
            else {
              fVar50 = (*p_Var18)(&pIVar44->super_ImGuiViewport);
            }
            fVar62 = (pIVar44->super_ImGuiViewport).DpiScale;
            if ((fVar62 != 0.0) || (NAN(fVar62))) {
              if (((fVar50 != fVar62) || (NAN(fVar50) || NAN(fVar62))) &&
                 (((pIVar22->IO).ConfigFlags & 0x4000) != 0)) {
                ScaleWindowsInViewport(pIVar44,fVar50 / fVar62);
              }
            }
            (pIVar44->super_ImGuiViewport).DpiScale = fVar50;
            uVar35 = (ulong)(iVar26 + 1);
          }
          else {
            lVar42 = (long)(pIVar22->Windows).Size;
            if (0 < lVar42) {
              ppIVar16 = (pIVar22->Windows).Data;
              lVar43 = 0;
              do {
                pIVar29 = ppIVar16[lVar43];
                if (pIVar29->Viewport == pIVar44) {
                  pIVar29->Viewport = (ImGuiViewportP *)0x0;
                  if ((pIVar22->Windows).Size <= lVar43) goto LAB_001287e2;
                  ppIVar16[lVar43]->ViewportOwned = false;
                }
                lVar43 = lVar43 + 1;
              } while (lVar42 != lVar43);
            }
            if (pIVar44 == pIVar22->MouseLastHoveredViewport) {
              pIVar22->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
            }
            if (iVar34 <= iVar26) {
              __assert_fail("it >= Data && it < Data + Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                            ,0x5da,
                            "T *ImVector<ImGuiViewportP *>::erase(const T *) [T = ImGuiViewportP *]"
                           );
            }
            ppIVar37 = ppIVar37 + uVar35;
            memmove(ppIVar37,ppIVar37 + 1,(~uVar35 + (long)iVar34) * 8);
            (pIVar22->Viewports).Size = (pIVar22->Viewports).Size + -1;
            DestroyPlatformWindow(pIVar44);
            ppIVar17 = (pIVar22->PlatformIO).Viewports.Data;
            ppIVar27 = ppIVar17;
            while (ppIVar27 < ppIVar17 + (pIVar22->PlatformIO).Viewports.Size) {
              pIVar28 = (ImGuiViewportP *)*ppIVar27;
              ppIVar27 = ppIVar27 + 1;
              if (pIVar28 == pIVar44) {
                __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                              ,0x2bb0,"void ImGui::UpdateViewportsNewFrame()");
              }
            }
            IM_DELETE<ImGuiViewportP>(pIVar44);
          }
          iVar34 = (pIVar22->Viewports).Size;
        } while ((int)uVar35 < iVar34);
        uVar35 = (ulong)(0 < iVar34);
      }
      if ((uVar30 >> 10 & 1) == 0) {
        pIVar22->MouseViewport = (ImGuiViewportP *)local_58._0_8_;
      }
      else {
        if (((pIVar22->IO).BackendFlags & 0x800) == 0) {
          lVar42 = (long)(GImGui->Viewports).Size;
          if (lVar42 < 1) {
LAB_0012592c:
            pIVar28 = (ImGuiViewportP *)0x0;
          }
          else {
            IVar53 = (pIVar22->IO).MousePos;
            fVar50 = IVar53.x;
            fVar62 = IVar53.y;
            lVar43 = 0;
            pIVar28 = (ImGuiViewportP *)0x0;
            do {
              pIVar31 = (GImGui->Viewports).Data[lVar43];
              if ((((((pIVar31->super_ImGuiViewport).Flags & 0x90) == 0) &&
                   (fVar61 = (pIVar31->super_ImGuiViewport).Pos.x, fVar61 <= fVar50)) &&
                  (fVar59 = (pIVar31->super_ImGuiViewport).Pos.y, fVar59 <= fVar62)) &&
                 (((fVar50 < fVar61 + (pIVar31->super_ImGuiViewport).Size.x &&
                   (fVar62 < fVar59 + (pIVar31->super_ImGuiViewport).Size.y)) &&
                  ((pIVar28 == (ImGuiViewportP *)0x0 ||
                   (pIVar28->LastFrontMostStampCount < pIVar31->LastFrontMostStampCount)))))) {
                pIVar28 = pIVar31;
              }
              lVar43 = lVar43 + 1;
            } while (lVar42 != lVar43);
          }
        }
        else {
          IVar8 = (pIVar22->IO).MouseHoveredViewport;
          if ((IVar8 != 0) && (lVar42 = (long)(GImGui->Viewports).Size, 0 < lVar42)) {
            lVar43 = 0;
            do {
              pIVar28 = (GImGui->Viewports).Data[lVar43];
              if ((pIVar28->super_ImGuiViewport).ID == IVar8) goto LAB_00125902;
              lVar43 = lVar43 + 1;
            } while (lVar42 != lVar43);
          }
          pIVar28 = (ImGuiViewportP *)0x0;
LAB_00125902:
          if (pIVar28 == (ImGuiViewportP *)0x0) goto LAB_0012592c;
          if (((pIVar28->super_ImGuiViewport).Flags & 0x10) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x2bfd,"void ImGui::UpdateViewportsNewFrame()");
          }
        }
        pIVar31 = pIVar28;
        if (pIVar28 == (ImGuiViewportP *)0x0) {
          if (pIVar22->MouseLastHoveredViewport == (ImGuiViewportP *)0x0) {
            if ((char)uVar35 == '\0') goto LAB_00128818;
            pIVar31 = *(pIVar22->Viewports).Data;
            goto LAB_00125936;
          }
        }
        else {
LAB_00125936:
          pIVar22->MouseLastHoveredViewport = pIVar31;
        }
        ppIVar37 = &pIVar22->MovingWindow->Viewport;
        if (pIVar22->MovingWindow == (ImGuiWindow *)0x0) {
          ppIVar37 = &pIVar22->MouseLastHoveredViewport;
        }
        pIVar31 = *ppIVar37;
        pIVar22->MouseViewport = pIVar31;
        if (pIVar22->DragDropActive == true && pIVar28 == (ImGuiViewportP *)0x0) {
          pIVar28 = pIVar22->MouseLastHoveredViewport;
        }
        if ((pIVar22->DragDropActive == false) && (pIVar22->ActiveId != 0)) {
          bVar24 = true;
          if ((GImGui->IO).MouseDown[0] == false) {
            uVar35 = 0;
            do {
              uVar46 = uVar35;
              if (uVar46 == 4) {
                uVar46 = 4;
                break;
              }
              uVar35 = uVar46 + 1;
            } while ((GImGui->IO).MouseDown[uVar46 + 1] != true);
            bVar24 = uVar46 < 4;
          }
          if (!bVar24) goto LAB_001259ff;
        }
        else {
LAB_001259ff:
          if (((pIVar28 != (ImGuiViewportP *)0x0) && (pIVar28 != pIVar31)) &&
             (((pIVar28->super_ImGuiViewport).Flags & 0x10) == 0)) {
            pIVar22->MouseViewport = pIVar28;
          }
        }
        if (pIVar22->MouseViewport == (ImGuiViewportP *)0x0) {
          __assert_fail("g.MouseViewport != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2c1f,"void ImGui::UpdateViewportsNewFrame()");
        }
      }
      ((ctx->IO).Fonts)->Locked = true;
      font = (GImGui->IO).FontDefault;
      if (font == (ImFont *)0x0) {
        pIVar12 = (GImGui->IO).Fonts;
        if ((pIVar12->Fonts).Size < 1) {
          pcVar32 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
          goto LAB_0012882d;
        }
        font = *(pIVar12->Fonts).Data;
      }
      SetCurrentFont(font);
      if (ctx->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
        __assert_fail("g.Font->IsLoaded()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0xf77,"void ImGui::NewFrame()");
      }
      lVar42 = (long)(ctx->Viewports).Size;
      if (lVar42 < 1) {
        fVar62 = -3.4028235e+38;
        fVar50 = 3.4028235e+38;
        fVar59 = 3.4028235e+38;
        fVar61 = -3.4028235e+38;
      }
      else {
        fVar59 = 3.4028235e+38;
        fVar61 = -3.4028235e+38;
        lVar43 = 0;
        fVar62 = -3.4028235e+38;
        fVar60 = 3.4028235e+38;
        do {
          pIVar28 = (ctx->Viewports).Data[lVar43];
          fVar50 = (pIVar28->super_ImGuiViewport).Pos.x;
          fVar52 = (pIVar28->super_ImGuiViewport).Pos.y;
          fVar51 = (pIVar28->super_ImGuiViewport).Size.x + fVar50;
          if (fVar51 <= fVar62) {
            fVar51 = fVar62;
          }
          fVar62 = fVar51;
          fVar51 = (pIVar28->super_ImGuiViewport).Size.y + fVar52;
          if (fVar51 <= fVar61) {
            fVar51 = fVar61;
          }
          fVar61 = fVar51;
          if (fVar60 <= fVar50) {
            fVar50 = fVar60;
          }
          if (fVar59 <= fVar52) {
            fVar52 = fVar59;
          }
          fVar59 = fVar52;
          lVar43 = lVar43 + 1;
          fVar60 = fVar50;
        } while (lVar42 != lVar43);
      }
      (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar50;
      (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar59;
      (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar62;
      (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar61;
      fVar50 = (ctx->Style).CircleSegmentMaxError;
      (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
      ImDrawListSharedData::SetCircleSegmentMaxError(&ctx->DrawListSharedData,fVar50);
      uVar30 = (uint)(ctx->Style).AntiAliasedLines;
      (ctx->DrawListSharedData).InitialFlags = uVar30;
      if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
         ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
        (ctx->DrawListSharedData).InitialFlags = uVar30 | 2;
      }
      if ((ctx->Style).AntiAliasedFill == true) {
        pIVar2 = &(ctx->DrawListSharedData).InitialFlags;
        *(byte *)pIVar2 = (byte)*pIVar2 | 4;
      }
      if (((ctx->IO).BackendFlags & 8) != 0) {
        pIVar2 = &(ctx->DrawListSharedData).InitialFlags;
        *(byte *)pIVar2 = (byte)*pIVar2 | 8;
      }
      if (0 < (ctx->Viewports).Size) {
        lVar42 = 0;
        do {
          pIVar28 = (ctx->Viewports).Data[lVar42];
          (pIVar28->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
          (pIVar28->DrawDataP).Valid = false;
          (pIVar28->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
          (pIVar28->DrawDataP).CmdLists = (ImDrawList **)0x0;
          (pIVar28->DrawDataP).CmdListsCount = 0;
          (pIVar28->DrawDataP).TotalIdxCount = 0;
          (pIVar28->DrawDataP).TotalVtxCount = 0;
          (pIVar28->DrawDataP).DisplayPos.x = 0.0;
          *(undefined8 *)&(pIVar28->DrawDataP).DisplayPos.y = 0;
          (pIVar28->DrawDataP).DisplaySize.x = 0.0;
          (pIVar28->DrawDataP).DisplaySize.y = 0.0;
          (pIVar28->DrawDataP).FramebufferScale.x = 0.0;
          (pIVar28->DrawDataP).FramebufferScale.y = 0.0;
          lVar42 = lVar42 + 1;
        } while (lVar42 < (ctx->Viewports).Size);
      }
      pIVar22 = GImGui;
      if ((ctx->DragDropActive != false) &&
         (IVar8 = (ctx->DragDropPayload).SourceId, IVar8 == ctx->ActiveId)) {
        if (GImGui->ActiveId == IVar8) {
          GImGui->ActiveIdIsAlive = IVar8;
        }
        if (pIVar22->ActiveIdPreviousFrame == IVar8) {
          pIVar22->ActiveIdPreviousFrameIsAlive = true;
        }
      }
      if (ctx->HoveredIdPreviousFrame == 0) {
        ctx->HoveredIdTimer = 0.0;
LAB_00125c3d:
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      else if ((ctx->HoveredId != 0) && (ctx->ActiveId == ctx->HoveredId)) goto LAB_00125c3d;
      IVar8 = ctx->HoveredId;
      if ((IVar8 != 0) &&
         (ctx->HoveredIdTimer = (ctx->IO).DeltaTime + ctx->HoveredIdTimer, ctx->ActiveId != IVar8))
      {
        ctx->HoveredIdNotActiveTimer = (ctx->IO).DeltaTime + ctx->HoveredIdNotActiveTimer;
      }
      ctx->HoveredIdPreviousFrame = IVar8;
      ctx->HoveredId = 0;
      ctx->HoveredIdAllowOverlap = false;
      ctx->HoveredIdDisabled = false;
      IVar8 = ctx->ActiveId;
      if (((ctx->ActiveIdIsAlive != IVar8) && (IVar8 != 0)) && (ctx->ActiveIdPreviousFrame == IVar8)
         ) {
        ClearActiveID();
      }
      IVar8 = ctx->ActiveId;
      if (IVar8 != 0) {
        ctx->ActiveIdTimer = (ctx->IO).DeltaTime + ctx->ActiveIdTimer;
      }
      ctx->LastActiveIdTimer = (ctx->IO).DeltaTime + ctx->LastActiveIdTimer;
      ctx->ActiveIdPreviousFrame = IVar8;
      ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
      ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
      ctx->ActiveIdIsAlive = 0;
      ctx->ActiveIdHasBeenEditedThisFrame = false;
      ctx->ActiveIdPreviousFrameIsAlive = false;
      ctx->ActiveIdIsJustActivated = false;
      if (IVar8 != ctx->TempInputId && ctx->TempInputId != 0) {
        ctx->TempInputId = 0;
      }
      if (IVar8 == 0) {
        ctx->ActiveIdUsingNavDirMask = 0;
        ctx->ActiveIdUsingNavInputMask = 0;
        ctx->ActiveIdUsingKeyInputMask = 0;
      }
      ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
      ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      ctx->DragDropAcceptIdCurr = 0;
      ctx->DragDropWithinSource = false;
      ctx->DragDropWithinTarget = false;
      ctx->DragDropHoldJustPressedId = 0;
      pIVar22 = GImGui;
      bVar24 = (GImGui->IO).KeyCtrl;
      uVar30 = bVar24 + 2;
      if ((GImGui->IO).KeyShift == false) {
        uVar30 = (uint)bVar24;
      }
      uVar49 = uVar30 + 4;
      if ((GImGui->IO).KeyAlt == false) {
        uVar49 = uVar30;
      }
      uVar30 = uVar49 + 8;
      if ((GImGui->IO).KeySuper == false) {
        uVar30 = uVar49;
      }
      (ctx->IO).KeyMods = uVar30;
      memcpy((ctx->IO).KeysDownDurationPrev,(ctx->IO).KeysDownDuration,0x800);
      lVar42 = 0x140;
      do {
        fVar50 = -1.0;
        if (*(char *)((long)(ctx->IO).KeyMap + lVar42 + -0x3c) == '\x01') {
          fVar62 = *(float *)((long)ctx + lVar42 * 4 + -0x68);
          fVar50 = 0.0;
          if (0.0 <= fVar62) {
            fVar50 = fVar62 + (ctx->IO).DeltaTime;
          }
        }
        *(float *)((long)ctx + lVar42 * 4 + -0x68) = fVar50;
        lVar42 = lVar42 + 1;
      } while (lVar42 != 0x340);
      (pIVar22->IO).WantSetMousePos = false;
      pIVar22->NavWrapRequestWindow = (ImGuiWindow *)0x0;
      pIVar22->NavWrapRequestFlags = 0;
      uVar30 = (pIVar22->IO).ConfigFlags;
      if ((uVar30 & 2) == 0) {
        uVar49 = 0;
      }
      else {
        uVar49 = (uint)CONCAT71((int7)((ulong)pIVar44 >> 8),(char)(pIVar22->IO).BackendFlags) &
                 0xffffff01;
      }
      if ((((char)uVar49 != '\0') && (pIVar22->NavInputSource != ImGuiInputSource_NavGamepad)) &&
         (((0.0 < (pIVar22->IO).NavInputs[0] ||
           ((0.0 < (pIVar22->IO).NavInputs[2] || (0.0 < (pIVar22->IO).NavInputs[1])))) ||
          ((0.0 < (pIVar22->IO).NavInputs[3] ||
           ((((0.0 < (pIVar22->IO).NavInputs[4] || (0.0 < (pIVar22->IO).NavInputs[5])) ||
             (0.0 < (pIVar22->IO).NavInputs[6])) || (0.0 < (pIVar22->IO).NavInputs[7])))))))) {
        pIVar22->NavInputSource = ImGuiInputSource_NavGamepad;
      }
      if ((uVar30 & 1) != 0) {
        iVar34 = (pIVar22->IO).KeyMap[0xc];
        if (-1 < (long)iVar34) {
          if (0x1ff < iVar34) goto LAB_001288cd;
          if ((pIVar22->IO).KeysDown[iVar34] == true) {
            (pIVar22->IO).NavInputs[0] = 1.0;
            pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        iVar34 = (pIVar22->IO).KeyMap[0xd];
        if (-1 < (long)iVar34) {
          if (0x1ff < iVar34) goto LAB_001288cd;
          if ((pIVar22->IO).KeysDown[iVar34] == true) {
            (pIVar22->IO).NavInputs[2] = 1.0;
            pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        iVar34 = (pIVar22->IO).KeyMap[0xe];
        if (-1 < (long)iVar34) {
          if (0x1ff < iVar34) goto LAB_001288cd;
          if ((pIVar22->IO).KeysDown[iVar34] == true) {
            (pIVar22->IO).NavInputs[1] = 1.0;
            pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        iVar34 = (pIVar22->IO).KeyMap[1];
        if (-1 < (long)iVar34) {
          if (0x1ff < iVar34) goto LAB_001288cd;
          if ((pIVar22->IO).KeysDown[iVar34] == true) {
            (pIVar22->IO).NavInputs[0x11] = 1.0;
            pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        iVar34 = (pIVar22->IO).KeyMap[2];
        if (-1 < (long)iVar34) {
          if (0x1ff < iVar34) goto LAB_001288cd;
          if ((pIVar22->IO).KeysDown[iVar34] == true) {
            (pIVar22->IO).NavInputs[0x12] = 1.0;
            pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        iVar34 = (pIVar22->IO).KeyMap[3];
        if (-1 < (long)iVar34) {
          if (0x1ff < iVar34) goto LAB_001288cd;
          if ((pIVar22->IO).KeysDown[iVar34] == true) {
            (pIVar22->IO).NavInputs[0x13] = 1.0;
            pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        iVar34 = (pIVar22->IO).KeyMap[4];
        if (-1 < (long)iVar34) {
          if (0x1ff < iVar34) {
LAB_001288cd:
            __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x12a0,"bool ImGui::IsKeyDown(int)");
          }
          if ((pIVar22->IO).KeysDown[iVar34] == true) {
            (pIVar22->IO).NavInputs[0x14] = 1.0;
            pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        bVar24 = (pIVar22->IO).KeyCtrl;
        if (bVar24 == true) {
          (pIVar22->IO).NavInputs[0xe] = 1.0;
        }
        if ((pIVar22->IO).KeyShift == true) {
          (pIVar22->IO).NavInputs[0xf] = 1.0;
        }
        if ((bVar24 == false) && ((pIVar22->IO).KeyAlt != false)) {
          (pIVar22->IO).NavInputs[0x10] = 1.0;
        }
      }
      pfVar6 = (pIVar22->IO).NavInputsDownDuration;
      pfVar38 = pfVar6;
      pfVar40 = (pIVar22->IO).NavInputsDownDurationPrev;
      for (lVar42 = 0x15; lVar42 != 0; lVar42 = lVar42 + -1) {
        *pfVar40 = *pfVar38;
        pfVar38 = pfVar38 + (ulong)bVar48 * -2 + 1;
        pfVar40 = pfVar40 + (ulong)bVar48 * -2 + 1;
      }
      lVar42 = 0;
      do {
        fVar50 = -1.0;
        if (0.0 < (pIVar22->IO).NavInputs[lVar42]) {
          fVar50 = 0.0;
          if (0.0 <= pfVar6[lVar42]) {
            fVar50 = pfVar6[lVar42] + (pIVar22->IO).DeltaTime;
          }
        }
        pfVar6[lVar42] = fVar50;
        lVar42 = lVar42 + 1;
      } while (lVar42 != 0x15);
      IVar8 = pIVar22->NavInitResultId;
      if (((IVar8 != 0) &&
          ((pIVar22->NavDisableHighlight != true || (pIVar22->NavInitRequestFromMove == true)))) &&
         (pIVar22->NavWindow != (ImGuiWindow *)0x0)) {
        IVar39 = pIVar22->NavLayer;
        if (pIVar22->NavInitRequestFromMove == true) {
          SetNavID(IVar8,IVar39,0);
          IVar53 = (pIVar22->NavInitResultRectRel).Max;
          pIVar7 = &pIVar22->NavWindow->NavRectRel[(int)IVar39].Min;
          *pIVar7 = (pIVar22->NavInitResultRectRel).Min;
          pIVar7[1] = IVar53;
          pIVar22->NavMousePosDirty = true;
          pIVar22->NavDisableHighlight = false;
          pIVar22->NavDisableMouseHover = true;
        }
        else {
          SetNavID(IVar8,IVar39,0);
        }
        IVar53 = (pIVar22->NavInitResultRectRel).Max;
        pIVar7 = &pIVar22->NavWindow->NavRectRel[pIVar22->NavLayer].Min;
        *pIVar7 = (pIVar22->NavInitResultRectRel).Min;
        pIVar7[1] = IVar53;
      }
      local_58._0_4_ = uVar49;
      pIVar22->NavInitRequest = false;
      pIVar22->NavInitRequestFromMove = false;
      pIVar22->NavInitResultId = 0;
      pIVar22->NavJustMovedToId = 0;
      pIVar23 = GImGui;
      if (pIVar22->NavMoveRequest == true) {
        IVar8 = (GImGui->NavMoveResultLocal).ID;
        if ((IVar8 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
          pIVar45 = GImGui;
          if (GImGui->NavId == 0) goto LAB_0012644f;
        }
        else {
          pIVar3 = &GImGui->NavMoveResultOther;
          pIVar41 = &GImGui->NavMoveResultLocal;
          if (IVar8 == 0) {
            pIVar41 = pIVar3;
          }
          if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
              (IVar8 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar8 != 0)) &&
             (IVar8 != GImGui->NavId)) {
            pIVar41 = &GImGui->NavMoveResultLocalVisibleSet;
          }
          if (((pIVar41 != pIVar3) && ((GImGui->NavMoveResultOther).ID != 0)) &&
             (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
            fVar50 = (GImGui->NavMoveResultOther).DistBox;
            fVar62 = pIVar41->DistBox;
            if (fVar62 <= fVar50) {
              if (((fVar50 != fVar62) || (NAN(fVar50) || NAN(fVar62))) ||
                 (pfVar6 = &(GImGui->NavMoveResultOther).DistCenter,
                 pIVar41->DistCenter < *pfVar6 || pIVar41->DistCenter == *pfVar6))
              goto LAB_001262d0;
            }
            pIVar41 = pIVar3;
          }
LAB_001262d0:
          if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
             (pIVar29 = pIVar41->Window, pIVar29 == (ImGuiWindow *)0x0)) {
            __assert_fail("g.NavWindow && result->Window",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x25d1,"void ImGui::NavUpdateMoveResult()");
          }
          if (GImGui->NavLayer == ImGuiNavLayer_Main) {
            if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
              fVar50 = (pIVar41->Window->Pos).x;
              fVar62 = (pIVar41->Window->Pos).y;
              local_68.Min.x = (pIVar41->RectRel).Min.x + fVar50;
              local_68.Max.x = fVar50 + (pIVar41->RectRel).Max.x;
              local_68.Min.y = (pIVar41->RectRel).Min.y + fVar62;
              local_68.Max.y = fVar62 + (pIVar41->RectRel).Max.y;
              IVar53 = ScrollToBringRectIntoView(pIVar41->Window,&local_68);
            }
            else {
              fVar50 = 0.0;
              if (GImGui->NavMoveDir == 2) {
                fVar50 = (pIVar29->ScrollMax).y;
              }
              IVar53 = (ImVec2)((ulong)(uint)((pIVar29->Scroll).y - fVar50) << 0x20);
              (pIVar29->ScrollTarget).y = fVar50;
              (pIVar29->ScrollTargetCenterRatio).y = 0.0;
              (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
            }
            fVar50 = (pIVar41->RectRel).Min.y;
            (pIVar41->RectRel).Min.x = (pIVar41->RectRel).Min.x - IVar53.x;
            (pIVar41->RectRel).Max.x = (pIVar41->RectRel).Max.x - IVar53.x;
            (pIVar41->RectRel).Min.y = fVar50 - IVar53.y;
            (pIVar41->RectRel).Max.y = (pIVar41->RectRel).Max.y - IVar53.y;
          }
          ClearActiveID();
          pIVar23->NavWindow = pIVar41->Window;
          IVar8 = pIVar41->ID;
          if (pIVar23->NavId != IVar8) {
            pIVar23->NavJustMovedToId = IVar8;
            pIVar23->NavJustMovedToFocusScopeId = pIVar41->FocusScopeId;
            pIVar23->NavJustMovedToKeyMods = pIVar23->NavMoveRequestKeyMods;
          }
          pIVar45 = GImGui;
          IVar39 = pIVar23->NavLayer;
          SetNavID(IVar8,IVar39,pIVar41->FocusScopeId);
          IVar53 = (pIVar41->RectRel).Max;
          pIVar7 = &pIVar45->NavWindow->NavRectRel[(int)IVar39].Min;
          *pIVar7 = (pIVar41->RectRel).Min;
          pIVar7[1] = IVar53;
          pIVar45->NavMousePosDirty = true;
        }
        pIVar45->NavDisableHighlight = false;
        pIVar45->NavDisableMouseHover = true;
      }
LAB_0012644f:
      if (pIVar22->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
        if (pIVar22->NavMoveRequest == false) {
          __assert_fail("g.NavMoveRequest",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x24cd,"void ImGui::NavUpdate()");
        }
        if (((pIVar22->NavMoveResultLocal).ID == 0) && ((pIVar22->NavMoveResultOther).ID == 0)) {
          pIVar22->NavDisableHighlight = false;
        }
        pIVar22->NavMoveRequestForward = ImGuiNavForward_None;
      }
      if ((pIVar22->NavMousePosDirty == true) && (pIVar22->NavIdIsAlive == true)) {
        if (((((pIVar22->IO).ConfigFlags & 4) != 0) &&
            (((((pIVar22->IO).BackendFlags & 4) != 0 && (pIVar22->NavDisableHighlight == false)) &&
             (pIVar22->NavDisableMouseHover == true)))) &&
           (pIVar22->NavWindow != (ImGuiWindow *)0x0)) {
          IVar53 = NavCalcPreferredRefPos();
          (pIVar22->IO).MousePosPrev = IVar53;
          (pIVar22->IO).MousePos = IVar53;
          (pIVar22->IO).WantSetMousePos = true;
        }
        pIVar22->NavMousePosDirty = false;
      }
      pIVar22->NavIdIsAlive = false;
      pIVar22->NavJustTabbedId = 0;
      IVar39 = pIVar22->NavLayer;
      if (ImGuiNavLayer_Menu < IVar39) {
        __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x24e3,"void ImGui::NavUpdate()");
      }
      pIVar29 = pIVar22->NavWindow;
      pIVar33 = pIVar29;
      if (pIVar29 != (ImGuiWindow *)0x0) {
        do {
          if ((pIVar33->RootWindowDockStop == pIVar33) ||
             ((pIVar33->Flags & 0x15000000U) != 0x1000000)) {
            if (pIVar33 != pIVar29) {
              pIVar33->NavLastChildNavWindow = pIVar29;
            }
            break;
          }
          ppIVar16 = &pIVar33->ParentWindow;
          pIVar33 = *ppIVar16;
        } while (*ppIVar16 != (ImGuiWindow *)0x0);
        if (((pIVar29 != (ImGuiWindow *)0x0) && (IVar39 == ImGuiNavLayer_Main)) &&
           (pIVar29->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
          pIVar29->NavLastChildNavWindow = (ImGuiWindow *)0x0;
        }
      }
      pIVar23 = GImGui;
      pIVar29 = GetTopMostPopupModal();
      if (pIVar29 != (ImGuiWindow *)0x0) {
        pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar23->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
         (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar50 = (pIVar23->IO).DeltaTime * -10.0 + pIVar23->NavWindowingHighlightAlpha;
        fVar50 = (float)(-(uint)(0.0 <= fVar50) & (uint)fVar50);
        pIVar23->NavWindowingHighlightAlpha = fVar50;
        if ((pIVar23->DimBgRatio <= 0.0) && (fVar50 <= 0.0)) {
          pIVar23->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
      }
      if ((pIVar29 == (ImGuiWindow *)0x0) && (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        bVar24 = (pIVar23->IO).NavInputsDownDuration[3] == 0.0;
      }
      else {
        bVar24 = false;
      }
      if ((((pIVar29 == (ImGuiWindow *)0x0) && (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0))
          && ((pIVar23->IO).KeyCtrl == true)) &&
         ((iVar34 = (pIVar23->IO).KeyMap[0], -1 < iVar34 &&
          (bVar25 = IsKeyPressed(iVar34,true), bVar25)))) {
        bVar48 = (byte)(pIVar23->IO).ConfigFlags & 1;
      }
      else {
        bVar48 = 0;
      }
      if (bVar24 || bVar48 != 0) {
        pIVar29 = pIVar23->NavWindow;
        if (pIVar29 == (ImGuiWindow *)0x0) {
          pIVar29 = FindWindowNavFocusable((pIVar23->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
        }
        if (pIVar29 != (ImGuiWindow *)0x0) {
          pIVar29 = pIVar29->RootWindowDockStop;
          pIVar23->NavWindowingTargetAnim = pIVar29;
          pIVar23->NavWindowingTarget = pIVar29;
          pIVar23->NavWindowingTimer = 0.0;
          pIVar23->NavWindowingHighlightAlpha = 0.0;
          pIVar23->NavWindowingToggleLayer = (bool)(bVar48 ^ 1);
          pIVar23->NavInputSource = ImGuiInputSource_NavGamepad - bVar48;
        }
      }
      fVar50 = (pIVar23->IO).DeltaTime + pIVar23->NavWindowingTimer;
      pIVar23->NavWindowingTimer = fVar50;
      if ((pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0) ||
         (pIVar23->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_001267af:
        uVar35 = 0;
        pIVar29 = (ImGuiWindow *)0x0;
      }
      else {
        fVar62 = (fVar50 + -0.2) / 0.05;
        fVar50 = 1.0;
        if (fVar62 <= 1.0) {
          fVar50 = fVar62;
        }
        fVar50 = (float)(~-(uint)(fVar62 < 0.0) & (uint)fVar50);
        uVar49 = -(uint)(fVar50 <= pIVar23->NavWindowingHighlightAlpha);
        pIVar23->NavWindowingHighlightAlpha =
             (float)(uVar49 & (uint)pIVar23->NavWindowingHighlightAlpha | ~uVar49 & (uint)fVar50);
        fVar50 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
        fVar62 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
        iVar34 = (uint)(0.0 < fVar50) - (uint)(0.0 < fVar62);
        if (iVar34 != 0) {
          NavUpdateWindowingHighlightWindow(iVar34);
          pIVar23->NavWindowingHighlightAlpha = 1.0;
        }
        if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_001267af;
        pbVar4 = &pIVar23->NavWindowingToggleLayer;
        *pbVar4 = (bool)(*pbVar4 &
                        (pIVar23->NavWindowingHighlightAlpha <= 1.0 &&
                        pIVar23->NavWindowingHighlightAlpha != 1.0));
        if (*pbVar4 == false) {
          pIVar29 = pIVar23->NavWindowingTarget;
          uVar35 = 0;
        }
        else {
          uVar35 = (ulong)CONCAT31((int3)((uint)iVar34 >> 8),
                                   pIVar23->NavWindow != (ImGuiWindow *)0x0);
          pIVar29 = (ImGuiWindow *)0x0;
        }
        pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar23->NavWindowingTarget != (ImGuiWindow *)0x0) &&
         (pIVar23->NavInputSource == ImGuiInputSource_NavKeyboard)) {
        fVar62 = (pIVar23->NavWindowingTimer + -0.2) / 0.05;
        fVar50 = 1.0;
        if (fVar62 <= 1.0) {
          fVar50 = fVar62;
        }
        fVar50 = (float)(~-(uint)(fVar62 < 0.0) & (uint)fVar50);
        uVar49 = -(uint)(fVar50 <= pIVar23->NavWindowingHighlightAlpha);
        pIVar23->NavWindowingHighlightAlpha =
             (float)(uVar49 & (uint)pIVar23->NavWindowingHighlightAlpha | ~uVar49 & (uint)fVar50);
        iVar34 = (GImGui->IO).KeyMap[0];
        if ((-1 < iVar34) && (bVar24 = IsKeyPressed(iVar34,true), bVar24)) {
          NavUpdateWindowingHighlightWindow((pIVar23->IO).KeyShift - 1 | 1);
        }
        if ((pIVar23->IO).KeyCtrl == false) {
          pIVar29 = pIVar23->NavWindowingTarget;
        }
      }
      pIVar45 = GImGui;
      fVar50 = (GImGui->IO).NavInputsDownDuration[0x10];
      if ((fVar50 == 0.0) && (!NAN(fVar50))) {
        pIVar23->NavWindowingToggleLayer = true;
      }
      if ((((pIVar23->ActiveId == 0) || (pIVar23->ActiveIdAllowOverlap == true)) && (fVar50 < 0.0))
         && ((pIVar23->NavWindowingToggleLayer != false &&
             (0.0 <= (pIVar45->IO).NavInputsDownDurationPrev[0x10])))) {
        bVar24 = IsMousePosValid(&(pIVar23->IO).MousePos);
        bVar25 = IsMousePosValid(&(pIVar23->IO).MousePosPrev);
        uVar49 = (uint)uVar35;
        uVar35 = 1;
        if (bVar25 != bVar24) {
          uVar35 = (ulong)(uVar49 & 0xff);
        }
      }
      pIVar33 = pIVar23->NavWindowingTarget;
      if ((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 4) == 0)) {
        IVar9 = pIVar23->NavInputSource;
        IVar53.x = 0.0;
        IVar53.y = 0.0;
        local_38 = uVar35;
        if ((IVar9 == ImGuiInputSource_NavKeyboard) && ((pIVar23->IO).KeyShift == false)) {
          IVar53 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
        }
        if (IVar9 == ImGuiInputSource_NavGamepad) {
          IVar53 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
        }
        uVar35 = local_38;
        fVar50 = IVar53.y;
        if (((IVar53.x != 0.0) || (fVar50 != 0.0)) || (NAN(fVar50))) {
          fVar62 = (pIVar23->IO).DisplayFramebufferScale.x;
          fVar61 = (pIVar23->IO).DisplayFramebufferScale.y;
          if (fVar61 <= fVar62) {
            fVar62 = fVar61;
          }
          fVar62 = (float)(int)(fVar62 * (pIVar23->IO).DeltaTime * 800.0);
          pIVar33 = pIVar33->RootWindow;
          local_68.Min.x = IVar53.x * fVar62 + (pIVar33->Pos).x;
          local_68.Min.y = fVar50 * fVar62 + (pIVar33->Pos).y;
          SetWindowPos(pIVar33,&local_68.Min,1);
          if (((pIVar33->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
          pIVar23->NavDisableMouseHover = true;
        }
      }
      if (pIVar29 != (ImGuiWindow *)0x0) {
        pIVar33 = pIVar23->NavWindow;
        if (pIVar33 == (ImGuiWindow *)0x0) {
          pIVar44 = (ImGuiViewportP *)0x0;
LAB_00126a19:
          ClearActiveID();
          pIVar23->NavDisableHighlight = false;
          pIVar23->NavDisableMouseHover = true;
          pIVar29 = NavRestoreLastChildNavWindow(pIVar29);
          ClosePopupsOverWindow(pIVar29,false);
          FocusWindow(pIVar29);
          if (pIVar29->NavLastIds[0] == 0) {
            NavInitWindow(pIVar29,false);
          }
          if ((pIVar29->DC).NavLayerActiveMask == 2) {
            pIVar23->NavLayer = ImGuiNavLayer_Menu;
          }
          if ((pIVar29->Viewport != pIVar44) &&
             (p_Var19 = (pIVar23->PlatformIO).Platform_SetWindowFocus,
             p_Var19 != (_func_void_ImGuiViewport_ptr *)0x0)) {
            (*p_Var19)(&pIVar29->Viewport->super_ImGuiViewport);
          }
          if (pIVar29 == (ImGuiWindow *)0x0) goto LAB_00126a95;
        }
        else if (pIVar29 != pIVar33->RootWindowDockStop) {
          pIVar44 = pIVar33->Viewport;
          goto LAB_00126a19;
        }
        pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
LAB_00126a95:
      if (((char)uVar35 != '\0') &&
         (pIVar29 = pIVar23->NavWindow, pIVar33 = pIVar29, pIVar29 != (ImGuiWindow *)0x0)) {
        while (window = pIVar33, window->ParentWindow != (ImGuiWindow *)0x0) {
          if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
             (pIVar33 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
        }
        if (window != pIVar29) {
          FocusWindow(window);
          window->NavLastChildNavWindow = pIVar29;
        }
        pIVar23->NavDisableHighlight = false;
        pIVar23->NavDisableMouseHover = true;
        IVar39 = ImGuiNavLayer_Main;
        if (((pIVar23->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
          IVar39 = pIVar23->NavLayer ^ ImGuiNavLayer_Menu;
        }
        if ((IVar39 == ImGuiNavLayer_Menu) && (window->DockNodeAsHost == (ImGuiDockNode *)0x0)) {
          pIVar23->NavWindow->NavLastIds[1] = 0;
        }
        NavRestoreLayer(IVar39);
      }
      if ((((uVar30 & 1) == 0 & (local_58[0] ^ 1)) == 0) &&
         (pIVar22->NavWindow != (ImGuiWindow *)0x0)) {
        bVar24 = (pIVar22->NavWindow->Flags & 0x40000U) == 0;
        (pIVar22->IO).NavActive = bVar24;
        if (((!bVar24) || (pIVar22->NavId == 0)) ||
           (bVar24 = true, pIVar22->NavDisableHighlight != false)) goto LAB_00126b8d;
      }
      else {
        (pIVar22->IO).NavActive = false;
LAB_00126b8d:
        bVar24 = pIVar22->NavWindowingTarget != (ImGuiWindow *)0x0;
      }
      (pIVar22->IO).NavVisible = bVar24;
      fVar50 = (GImGui->IO).NavInputsDownDuration[1];
      if ((fVar50 == 0.0) && (!NAN(fVar50))) {
        if (pIVar22->ActiveId == 0) {
          pIVar29 = pIVar22->NavWindow;
          if (((pIVar29 == (ImGuiWindow *)0x0) || ((pIVar29->Flags & 0x5000000U) != 0x1000000)) ||
             ((pIVar29->ParentWindow == (ImGuiWindow *)0x0 ||
              (pIVar29 == pIVar29->RootWindowDockStop)))) {
            iVar34 = (pIVar22->OpenPopupStack).Size;
            if ((long)iVar34 < 1) {
              if (pIVar22->NavLayer == ImGuiNavLayer_Main) {
                if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x5000000U) != 0x1000000))
                {
                  pIVar29->NavLastIds[0] = 0;
                }
                pIVar22->NavId = 0;
                pIVar22->NavFocusScopeId = 0;
              }
              else {
                NavRestoreLayer(ImGuiNavLayer_Main);
              }
            }
            else if ((((pIVar22->OpenPopupStack).Data[(long)iVar34 + -1].Window)->Flags & 0x8000000)
                     == 0) {
              ClosePopupToLevel(iVar34 + -1,true);
            }
          }
          else {
            if (pIVar29->ChildId == 0) {
              __assert_fail("child_window->ChildId != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                            ,0x2500,"void ImGui::NavUpdate()");
            }
            FocusWindow(pIVar29->ParentWindow);
            pIVar23 = GImGui;
            pIVar33 = GImGui->NavWindow;
            if (pIVar33 == (ImGuiWindow *)0x0) {
              __assert_fail("g.NavWindow",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                            ,0x22d9,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
            }
            IVar8 = pIVar29->ChildId;
            GImGui->NavId = IVar8;
            pIVar23->NavFocusScopeId = 0;
            pIVar33->NavLastIds[0] = IVar8;
            pIVar22->NavIdIsAlive = false;
            if (pIVar22->NavDisableMouseHover == true) {
              pIVar22->NavMousePosDirty = true;
            }
          }
        }
        else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
          ClearActiveID();
        }
      }
      pIVar22->NavActivateId = 0;
      pIVar22->NavActivateDownId = 0;
      pIVar22->NavActivatePressedId = 0;
      pIVar23 = GImGui;
      pIVar22->NavInputId = 0;
      IVar8 = pIVar22->NavId;
      if ((((IVar8 != 0) && (pIVar22->NavDisableHighlight == false)) &&
          (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
         ((pIVar22->NavWindow != (ImGuiWindow *)0x0 && ((pIVar22->NavWindow->Flags & 0x40000) == 0))
         )) {
        fVar50 = (GImGui->IO).NavInputs[0];
        if (0.0 < fVar50) {
          bVar24 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
        }
        else {
          bVar24 = false;
        }
        IVar10 = pIVar22->ActiveId;
        if (bVar24 && IVar10 == 0) {
          pIVar22->NavActivateId = IVar8;
        }
        if (IVar10 == 0) {
          if (0.0 < fVar50) goto LAB_001284ac;
        }
        else if (IVar10 == IVar8 && 0.0 < fVar50) {
LAB_001284ac:
          pIVar22->NavActivateDownId = IVar8;
        }
        if (IVar10 == 0) {
          if (bVar24) goto LAB_001284c3;
        }
        else if ((bool)(bVar24 & IVar10 == IVar8)) {
LAB_001284c3:
          pIVar22->NavActivatePressedId = IVar8;
        }
        if (((IVar10 == 0 || IVar10 == IVar8) &&
            (fVar50 = (pIVar23->IO).NavInputsDownDuration[2], fVar50 == 0.0)) && (!NAN(fVar50))) {
          pIVar22->NavInputId = IVar8;
        }
      }
      pIVar29 = pIVar22->NavWindow;
      if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x40000) != 0)) {
        pIVar22->NavDisableHighlight = true;
      }
      IVar8 = pIVar22->NavActivateId;
      if ((IVar8 != 0) && (pIVar22->NavActivateDownId != IVar8)) {
        __assert_fail("g.NavActivateDownId == g.NavActivateId",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x252e,"void ImGui::NavUpdate()");
      }
      pIVar22->NavMoveRequest = false;
      IVar8 = pIVar22->NavNextActivateId;
      if (IVar8 != 0) {
        pIVar22->NavInputId = IVar8;
        pIVar22->NavActivatePressedId = IVar8;
        pIVar22->NavActivateDownId = IVar8;
        pIVar22->NavActivateId = IVar8;
      }
      pIVar22->NavNextActivateId = 0;
      if (pIVar22->NavMoveRequestForward == ImGuiNavForward_None) {
        pIVar22->NavMoveDir = -1;
        pIVar22->NavMoveRequestFlags = 0;
        if (((pIVar29 != (ImGuiWindow *)0x0) && (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0))
           && ((pIVar29->Flags & 0x40000) == 0)) {
          uVar49 = GImGui->ActiveIdUsingNavDirMask;
          if (((uVar49 & 1) == 0) &&
             ((fVar50 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
              (fVar50 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
            pIVar22->NavMoveDir = 0;
          }
          if (((uVar49 & 2) == 0) &&
             ((fVar50 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
              (fVar50 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
            pIVar22->NavMoveDir = 1;
          }
          if (((uVar49 & 4) == 0) &&
             ((fVar50 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
              (fVar50 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
            pIVar22->NavMoveDir = 2;
          }
          if (((uVar49 & 8) == 0) &&
             ((fVar50 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
              (fVar50 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
            pIVar22->NavMoveDir = 3;
          }
        }
        pIVar22->NavMoveClipDir = pIVar22->NavMoveDir;
      }
      else {
        if ((pIVar22->NavMoveDir == -1) || (pIVar22->NavMoveClipDir == -1)) {
          __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2549,"void ImGui::NavUpdate()");
        }
        if (pIVar22->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
          __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x254a,"void ImGui::NavUpdate()");
        }
        pIVar22->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
      }
      pIVar23 = GImGui;
      fVar50 = 0.0;
      if (((((uVar30 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
          (pIVar29 = GImGui->NavWindow, pIVar29 != (ImGuiWindow *)0x0)) &&
         ((((pIVar29->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0))
          && (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
        bVar24 = IsKeyDown((GImGui->IO).KeyMap[5]);
        bVar25 = false;
        bVar47 = false;
        if (bVar24) {
          bVar47 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
        }
        bVar24 = IsKeyDown((pIVar23->IO).KeyMap[6]);
        if (bVar24) {
          bVar25 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
        }
        bVar24 = IsKeyPressed((pIVar23->IO).KeyMap[7],true);
        if (bVar24) {
          local_58._0_4_ =
               (int)CONCAT71((int7)((ulong)GImGui >> 8),
                             (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0);
        }
        else {
          auVar21._12_4_ = 0;
          auVar21._0_12_ = local_58._4_12_;
          local_58._0_16_ = auVar21 << 0x20;
        }
        bVar24 = IsKeyPressed((pIVar23->IO).KeyMap[8],true);
        if (bVar24) {
          bVar24 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
        }
        else {
          bVar24 = false;
        }
        fVar50 = 0.0;
        if ((bVar47 != bVar25) || ((bool)local_58[0] != bVar24)) {
          if (((pIVar29->DC).NavLayerActiveMask == 0) && ((pIVar29->DC).NavHasScroll == true)) {
            bVar25 = IsKeyPressed((pIVar23->IO).KeyMap[5],true);
            if (bVar25) {
              fVar50 = (pIVar29->Scroll).y -
                       ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y);
LAB_00128780:
              (pIVar29->ScrollTarget).y = fVar50;
            }
            else {
              bVar25 = IsKeyPressed((pIVar23->IO).KeyMap[6],true);
              if (bVar25) {
                fVar50 = ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) +
                         (pIVar29->Scroll).y;
                goto LAB_00128780;
              }
              if (local_58[0] == '\0') {
                if (bVar24 == false) goto LAB_00128799;
                fVar50 = (pIVar29->ScrollMax).y;
                goto LAB_00128780;
              }
              (pIVar29->ScrollTarget).y = 0.0;
            }
            (pIVar29->ScrollTargetCenterRatio).y = 0.0;
            (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00128799:
            fVar50 = 0.0;
          }
          else {
            IVar39 = pIVar23->NavLayer;
            pIVar36 = pIVar29->NavRectRel + IVar39;
            fVar50 = GImGui->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
            if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
              fVar50 = fVar50 * pIVar29->ParentWindow->FontWindowScale;
            }
            fVar50 = (pIVar29->NavRectRel[IVar39].Max.y - pIVar29->NavRectRel[IVar39].Min.y) +
                     (((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) - fVar50);
            fVar50 = (float)(~-(uint)(fVar50 <= 0.0) & (uint)fVar50);
            bVar25 = IsKeyPressed((pIVar23->IO).KeyMap[5],true);
            if (bVar25) {
              fVar50 = -fVar50;
              pIVar23->NavMoveDir = 3;
              pIVar23->NavMoveClipDir = 2;
              pIVar23->NavMoveRequestFlags = 0x30;
            }
            else {
              bVar25 = IsKeyPressed((pIVar23->IO).KeyMap[6],true);
              if (!bVar25) {
                if (local_58[0] == '\0') {
                  fVar50 = 0.0;
                  if (bVar24 != false) {
                    fVar62 = ((pIVar29->ScrollMax).y + (pIVar29->SizeFull).y) - (pIVar29->Scroll).y;
                    pIVar29->NavRectRel[IVar39].Max.y = fVar62;
                    pIVar29->NavRectRel[IVar39].Min.y = fVar62;
                    fVar62 = (pIVar36->Min).x;
                    pIVar7 = &pIVar29->NavRectRel[IVar39].Max;
                    if (pIVar7->x <= fVar62 && fVar62 != pIVar7->x) {
                      pIVar29->NavRectRel[IVar39].Max.x = 0.0;
                      (pIVar36->Min).x = 0.0;
                    }
                    pIVar23->NavMoveDir = 2;
                    pIVar23->NavMoveRequestFlags = 0x50;
                  }
                  goto LAB_00126fe6;
                }
                fVar50 = -(pIVar29->Scroll).y;
                pIVar29->NavRectRel[IVar39].Max.y = fVar50;
                pIVar29->NavRectRel[IVar39].Min.y = fVar50;
                fVar50 = (pIVar36->Min).x;
                pIVar7 = &pIVar29->NavRectRel[IVar39].Max;
                if (pIVar7->x <= fVar50 && fVar50 != pIVar7->x) {
                  pIVar29->NavRectRel[IVar39].Max.x = 0.0;
                  (pIVar36->Min).x = 0.0;
                }
                pIVar23->NavMoveDir = 3;
                pIVar23->NavMoveRequestFlags = 0x50;
                goto LAB_00128799;
              }
              pIVar23->NavMoveDir = 2;
              pIVar23->NavMoveClipDir = 3;
              pIVar23->NavMoveRequestFlags = 0x30;
            }
          }
        }
      }
LAB_00126fe6:
      uVar30 = pIVar22->NavMoveDir;
      if (uVar30 != 0xffffffff) {
        pIVar22->NavMoveRequest = true;
        pIVar22->NavMoveRequestKeyMods = (pIVar22->IO).KeyMods;
        pIVar22->NavMoveDirLast = uVar30;
      }
      bVar24 = pIVar22->NavMoveRequest;
      if ((bVar24 == true) && (pIVar22->NavId == 0)) {
        pIVar22->NavInitRequest = true;
        pIVar22->NavInitRequestFromMove = true;
        pIVar22->NavInitResultId = 0;
        pIVar22->NavDisableHighlight = false;
      }
      pIVar23 = GImGui;
      if (GImGui->NavMoveRequest == false) {
        pbVar4 = &GImGui->NavInitRequest;
        GImGui->NavAnyRequest = *pbVar4;
        if (*pbVar4 != false) goto LAB_0012707a;
      }
      else {
        GImGui->NavAnyRequest = true;
LAB_0012707a:
        if (pIVar23->NavWindow == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2439,"void ImGui::NavUpdateAnyRequestFlag()");
        }
      }
      pIVar29 = pIVar22->NavWindow;
      if (((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x40000) == 0)) &&
         (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar62 = pIVar23->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
        if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
          fVar62 = fVar62 * pIVar29->ParentWindow->FontWindowScale;
        }
        fVar62 = (float)(int)(fVar62 * 100.0 * (pIVar22->IO).DeltaTime + 0.5);
        local_58._0_16_ = ZEXT416((uint)fVar62);
        if (((pIVar29->DC).NavLayerActiveMask == 0) && (((pIVar29->DC).NavHasScroll & bVar24) == 1))
        {
          if (uVar30 < 2) {
            (pIVar29->ScrollTarget).x =
                 (float)(int)(*(float *)(&DAT_0019f21c + (ulong)(uVar30 == 0) * 4) * fVar62 +
                             (pIVar29->Scroll).x);
            (pIVar29->ScrollTargetCenterRatio).x = 0.0;
            (pIVar29->ScrollTargetEdgeSnapDist).x = 0.0;
          }
          if ((uVar30 & 0xfffffffe) == 2) {
            (pIVar29->ScrollTarget).y =
                 (float)(int)(*(float *)(&DAT_0019f21c + (ulong)(uVar30 == 2) * 4) * fVar62 +
                             (pIVar29->Scroll).y);
            (pIVar29->ScrollTargetCenterRatio).y = 0.0;
            (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
        IVar53 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
        fVar62 = IVar53.x;
        fVar61 = IVar53.y;
        if (((fVar62 != 0.0) || (NAN(fVar62))) && (pIVar29->ScrollbarX == true)) {
          (pIVar29->ScrollTarget).x =
               (float)(int)(fVar62 * (float)local_58._0_4_ + (pIVar29->Scroll).x);
          (pIVar29->ScrollTargetCenterRatio).x = 0.0;
          (pIVar29->ScrollTargetEdgeSnapDist).x = 0.0;
        }
        if ((fVar61 != 0.0) || (NAN(fVar61))) {
          (pIVar29->ScrollTarget).y =
               (float)(int)(fVar61 * (float)local_58._0_4_ + (pIVar29->Scroll).y);
          (pIVar29->ScrollTargetCenterRatio).y = 0.0;
          (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      (pIVar22->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
      (pIVar22->NavMoveResultLocal).ID = 0;
      (pIVar22->NavMoveResultLocal).FocusScopeId = 0;
      (pIVar22->NavMoveResultLocal).DistAxial = 3.4028235e+38;
      (pIVar22->NavMoveResultLocal).DistBox = 3.4028235e+38;
      (pIVar22->NavMoveResultLocal).DistCenter = 3.4028235e+38;
      (pIVar22->NavMoveResultLocal).RectRel.Min.x = 0.0;
      (pIVar22->NavMoveResultLocal).RectRel.Min.y = 0.0;
      (pIVar22->NavMoveResultLocal).RectRel.Max.x = 0.0;
      (pIVar22->NavMoveResultLocal).RectRel.Max.y = 0.0;
      (pIVar22->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
      (pIVar22->NavMoveResultLocalVisibleSet).ID = 0;
      (pIVar22->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
      (pIVar22->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
      (pIVar22->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
      (pIVar22->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
      (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
      (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
      (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
      (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
      (pIVar22->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
      (pIVar22->NavMoveResultOther).ID = 0;
      (pIVar22->NavMoveResultOther).FocusScopeId = 0;
      (pIVar22->NavMoveResultOther).DistAxial = 3.4028235e+38;
      (pIVar22->NavMoveResultOther).DistBox = 3.4028235e+38;
      (pIVar22->NavMoveResultOther).DistCenter = 3.4028235e+38;
      (pIVar22->NavMoveResultOther).RectRel.Min.x = 0.0;
      (pIVar22->NavMoveResultOther).RectRel.Min.y = 0.0;
      (pIVar22->NavMoveResultOther).RectRel.Max.x = 0.0;
      (pIVar22->NavMoveResultOther).RectRel.Max.y = 0.0;
      if (((bVar24 != false) && (pIVar22->NavInputSource == ImGuiInputSource_NavGamepad)) &&
         (pIVar22->NavLayer == ImGuiNavLayer_Main)) {
        fVar62 = (pIVar29->Pos).x;
        fVar61 = (pIVar29->Pos).y;
        local_68.Min.x = ((pIVar29->InnerRect).Min.x - fVar62) + -1.0;
        fVar59 = ((pIVar29->InnerRect).Min.y - fVar61) + -1.0;
        local_68.Min.y = fVar59;
        fVar60 = ((pIVar29->InnerRect).Max.x - fVar62) + 1.0;
        fVar62 = ((pIVar29->InnerRect).Max.y - fVar61) + 1.0;
        local_68.Max.y = fVar62;
        local_68.Max.x = fVar60;
        if (((pIVar29->NavRectRel[0].Min.x < local_68.Min.x) ||
            (pIVar29->NavRectRel[0].Min.y < fVar59)) ||
           ((fVar60 < pIVar29->NavRectRel[0].Max.x || (fVar62 < pIVar29->NavRectRel[0].Max.y)))) {
          fVar61 = pIVar23->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
          if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
            fVar61 = fVar61 * pIVar29->ParentWindow->FontWindowScale;
          }
          fVar61 = fVar61 * 0.5;
          fVar52 = fVar60 - local_68.Min.x;
          if (fVar61 <= fVar60 - local_68.Min.x) {
            fVar52 = fVar61;
          }
          fVar51 = fVar62 - fVar59;
          if (fVar61 <= fVar62 - fVar59) {
            fVar51 = fVar61;
          }
          local_68.Min.y = fVar59 + fVar51;
          local_68.Min.x = local_68.Min.x + fVar52;
          local_68.Max.y = fVar62 - fVar51;
          local_68.Max.x = fVar60 - fVar52;
          ImRect::ClipWithFull(pIVar29->NavRectRel,&local_68);
          pIVar22->NavId = 0;
          pIVar22->NavFocusScopeId = 0;
        }
      }
      pIVar29 = pIVar22->NavWindow;
      if (pIVar29 == (ImGuiWindow *)0x0) {
LAB_00127494:
        fVar59 = 0.0;
        fVar62 = 0.0;
        fVar61 = 0.0;
        fVar60 = 0.0;
      }
      else {
        IVar39 = pIVar22->NavLayer;
        fVar62 = pIVar29->NavRectRel[IVar39].Min.x;
        fVar61 = pIVar29->NavRectRel[IVar39].Max.x;
        if (fVar61 < fVar62) goto LAB_00127494;
        fVar59 = pIVar29->NavRectRel[IVar39].Min.y;
        fVar60 = pIVar29->NavRectRel[IVar39].Max.y;
        if (fVar60 < fVar59) goto LAB_00127494;
      }
      if (pIVar29 == (ImGuiWindow *)0x0) {
        fVar59 = 0.0;
        fVar62 = 0.0;
        fVar60 = 0.0;
        fVar61 = 0.0;
      }
      else {
        fVar52 = (pIVar29->Pos).x;
        fVar51 = (pIVar29->Pos).y;
        fVar62 = fVar62 + fVar52;
        fVar59 = fVar59 + fVar51;
        fVar61 = fVar61 + fVar52;
        fVar60 = fVar60 + fVar51;
      }
      (pIVar22->NavScoringRect).Min.y = fVar59 + fVar50;
      (pIVar22->NavScoringRect).Max.y = fVar60 + fVar50;
      fVar52 = fVar62 + 1.0;
      if (fVar61 <= fVar62 + 1.0) {
        fVar52 = fVar61;
      }
      (pIVar22->NavScoringRect).Min.x = fVar52;
      (pIVar22->NavScoringRect).Max.x = fVar52;
      if (fVar60 + fVar50 < fVar59 + fVar50) {
        __assert_fail("!g.NavScoringRect.IsInverted()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2599,"void ImGui::NavUpdate()");
      }
      pIVar22->NavScoringCount = 0;
      pIVar22 = GImGui;
      pIVar7 = &(GImGui->IO).MousePos;
      bVar24 = IsMousePosValid(pIVar7);
      if (bVar24) {
        IVar54.x = (float)(int)(pIVar22->IO).MousePos.x;
        IVar54.y = (float)(int)(pIVar22->IO).MousePos.y;
        pIVar22->LastValidMousePos = IVar54;
        (pIVar22->IO).MousePos = IVar54;
      }
      bVar24 = IsMousePosValid(pIVar7);
      if ((bVar24) && (bVar24 = IsMousePosValid(&(pIVar22->IO).MousePosPrev), bVar24)) {
        IVar55.x = (pIVar22->IO).MousePos.x - (pIVar22->IO).MousePosPrev.x;
        IVar55.y = (pIVar22->IO).MousePos.y - (pIVar22->IO).MousePosPrev.y;
        (pIVar22->IO).MouseDelta = IVar55;
      }
      else {
        (pIVar22->IO).MouseDelta.x = 0.0;
        (pIVar22->IO).MouseDelta.y = 0.0;
      }
      if ((((pIVar22->IO).MouseDelta.x != 0.0) ||
          (fVar50 = (pIVar22->IO).MouseDelta.y, fVar50 != 0.0)) || (NAN(fVar50))) {
        pIVar22->NavDisableMouseHover = false;
      }
      (pIVar22->IO).MousePosPrev = (pIVar22->IO).MousePos;
      lVar42 = -5;
      do {
        fVar50 = -1.0;
        bVar24 = (pIVar22->IO).MouseDown[lVar42 + 5];
        if (bVar24 == true) {
          pfVar6 = (pIVar22->IO).MouseDownDurationPrev + lVar42;
          bVar25 = *pfVar6 <= 0.0 && *pfVar6 != 0.0;
        }
        else {
          bVar25 = false;
        }
        (pIVar22->IO).MouseDoubleClicked[lVar42] = bVar25;
        if (bVar24 == false) {
          bVar47 = 0.0 <= (pIVar22->IO).MouseDownDurationPrev[lVar42];
        }
        else {
          bVar47 = false;
        }
        (pIVar22->IO).MouseDownOwned[lVar42] = bVar47;
        fVar62 = (pIVar22->IO).MouseDownDurationPrev[lVar42];
        (&(pIVar22->IO).MouseDragMaxDistanceAbs[0].x)[lVar42] = fVar62;
        if ((bVar24 != false) && (fVar50 = 0.0, 0.0 <= fVar62)) {
          fVar50 = fVar62 + (pIVar22->IO).DeltaTime;
        }
        (pIVar22->IO).MouseDownDurationPrev[lVar42] = fVar50;
        (pIVar22->IO).MouseReleased[lVar42] = false;
        if (bVar25 == false) {
          if (bVar24 != false) {
            bVar24 = IsMousePosValid(pIVar7);
            fVar50 = 0.0;
            fVar62 = 0.0;
            if (bVar24) {
              fVar50 = (pIVar22->IO).MousePos.x -
                       *(float *)((pIVar22->IO).MouseClickedTime + lVar42);
              fVar62 = (pIVar22->IO).MousePos.y -
                       *(float *)((long)(pIVar22->IO).MouseClickedTime + lVar42 * 8 + 4);
            }
            fVar61 = (pIVar22->IO).KeysDownDuration[lVar42];
            fVar59 = -fVar62;
            if (-fVar62 <= fVar62) {
              fVar59 = fVar62;
            }
            fVar62 = fVar50 * fVar50 + fVar62 * fVar62;
            uVar30 = -(uint)(fVar62 <= fVar61);
            (pIVar22->IO).KeysDownDuration[lVar42] =
                 (float)(~uVar30 & (uint)fVar62 | (uint)fVar61 & uVar30);
            fVar62 = -fVar50;
            if (-fVar50 <= fVar50) {
              fVar62 = fVar50;
            }
            fVar50 = (pIVar22->IO).MouseDragMaxDistanceSqr[lVar42 * 2];
            fVar61 = (pIVar22->IO).MouseDragMaxDistanceSqr[lVar42 * 2 + 1];
            uVar30 = -(uint)(fVar62 <= fVar50);
            (pIVar22->IO).MouseDragMaxDistanceSqr[lVar42 * 2] =
                 (float)(~uVar30 & (uint)fVar62 | (uint)fVar50 & uVar30);
            uVar30 = -(uint)(fVar59 <= fVar61);
            (pIVar22->IO).MouseDragMaxDistanceSqr[lVar42 * 2 + 1] =
                 (float)(~uVar30 & (uint)fVar59 | (uint)fVar61 & uVar30);
          }
        }
        else {
          dVar56 = pIVar22->Time;
          if ((float)(dVar56 - *(double *)((pIVar22->IO).MouseClicked + lVar42 * 8)) <
              (pIVar22->IO).MouseDoubleClickTime) {
            bVar24 = IsMousePosValid(pIVar7);
            fVar50 = 0.0;
            fVar62 = 0.0;
            if (bVar24) {
              fVar50 = (pIVar22->IO).MousePos.x -
                       *(float *)((pIVar22->IO).MouseClickedTime + lVar42);
              fVar62 = (pIVar22->IO).MousePos.y -
                       *(float *)((long)(pIVar22->IO).MouseClickedTime + lVar42 * 8 + 4);
            }
            fVar61 = (pIVar22->IO).MouseDoubleClickMaxDist;
            if (fVar50 * fVar50 + fVar62 * fVar62 < fVar61 * fVar61) {
              (pIVar22->IO).MouseReleased[lVar42] = true;
            }
            dVar56 = (double)((pIVar22->IO).MouseDoubleClickTime * -2.0);
          }
          *(double *)((pIVar22->IO).MouseClicked + lVar42 * 8) = dVar56;
          *(ImVec2 *)((pIVar22->IO).MouseClickedTime + lVar42) = (pIVar22->IO).MousePos;
          *(bool *)((long)(pIVar22->IO).MouseDownDuration + lVar42 + -3) =
               (pIVar22->IO).MouseReleased[lVar42];
          pfVar6 = (pIVar22->IO).MouseDragMaxDistanceSqr + lVar42 * 2;
          pfVar6[0] = 0.0;
          pfVar6[1] = 0.0;
          (pIVar22->IO).KeysDownDuration[lVar42] = 0.0;
        }
        if (((pIVar22->IO).MouseDown[lVar42 + 5] == false) &&
           ((pIVar22->IO).MouseDownOwned[lVar42] == false)) {
          *(undefined1 *)((long)(pIVar22->IO).MouseDownDuration + lVar42 + -3) = 0;
        }
        if ((pIVar22->IO).MouseDoubleClicked[lVar42] == true) {
          pIVar22->NavDisableMouseHover = false;
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 != 0);
      DockContextUpdateUndocking(ctx);
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar29 = GetTopMostPopupModal();
      if ((pIVar29 != (ImGuiWindow *)0x0) ||
         ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha))
         )) {
        fVar50 = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
        if (1.0 <= fVar50) {
          fVar50 = 1.0;
        }
        ctx->DimBgRatio = fVar50;
      }
      else {
        fVar50 = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
        ctx->DimBgRatio = (float)(-(uint)(0.0 <= fVar50) & (uint)fVar50);
      }
      ctx->MouseCursor = 0;
      ctx->WantTextInputNextFrame = -1;
      ctx->WantCaptureMouseNextFrame = -1;
      ctx->WantCaptureKeyboardNextFrame = -1;
      (ctx->PlatformImePos).x = 1.0;
      (ctx->PlatformImePos).y = 1.0;
      ctx->PlatformImePosViewport = (ImGuiViewportP *)0x0;
      pIVar22 = GImGui;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
        bVar24 = IsMousePosValid((ImVec2 *)0x0);
        if ((bVar24) &&
           (fVar50 = (pIVar22->IO).MouseDragThreshold,
           fVar62 = (pIVar22->IO).MousePos.x - (pIVar22->WheelingWindowRefMousePos).x,
           fVar61 = (pIVar22->IO).MousePos.y - (pIVar22->WheelingWindowRefMousePos).y,
           fVar50 * fVar50 < fVar62 * fVar62 + fVar61 * fVar61)) {
          pIVar22->WheelingWindowTimer = 0.0;
        }
        if (pIVar22->WheelingWindowTimer <= 0.0) {
          pIVar22->WheelingWindow = (ImGuiWindow *)0x0;
          pIVar22->WheelingWindowTimer = 0.0;
        }
      }
      pIVar23 = GImGui;
      fVar50 = (pIVar22->IO).MouseWheel;
      if (((fVar50 != 0.0) || (fVar62 = (pIVar22->IO).MouseWheelH, fVar62 != 0.0)) || (NAN(fVar62)))
      {
        pIVar29 = pIVar22->WheelingWindow;
        if (pIVar29 == (ImGuiWindow *)0x0) {
          pIVar29 = pIVar22->HoveredWindow;
        }
        if ((pIVar29 != (ImGuiWindow *)0x0) && (pIVar29->Collapsed == false)) {
          fVar62 = 0.0;
          if ((fVar50 != 0.0) || (NAN(fVar50))) {
            if (((pIVar22->IO).KeyCtrl == true) && ((pIVar22->IO).FontAllowUserScaling == true)) {
              if (GImGui->WheelingWindow != pIVar29) {
                GImGui->WheelingWindow = pIVar29;
                pIVar23->WheelingWindowRefMousePos = (pIVar23->IO).MousePos;
                pIVar23->WheelingWindowTimer = 2.0;
              }
              fVar50 = pIVar29->FontWindowScale;
              fVar61 = (pIVar22->IO).MouseWheel * 0.1 + fVar50;
              fVar62 = 2.5;
              if (fVar61 <= 2.5) {
                fVar62 = fVar61;
              }
              fVar62 = (float)(-(uint)(fVar61 < 0.5) & 0x3f000000 |
                              ~-(uint)(fVar61 < 0.5) & (uint)fVar62);
              pIVar29->FontWindowScale = fVar62;
              if ((pIVar29->Flags & 0x1000000) == 0) {
                fVar62 = fVar62 / fVar50;
                fVar50 = (pIVar29->Size).x;
                fVar61 = (pIVar29->Size).y;
                fVar59 = (pIVar29->Pos).x;
                fVar60 = (pIVar29->Pos).y;
                local_68.Min.y =
                     (((pIVar22->IO).MousePos.y - fVar60) * (1.0 - fVar62) * fVar61) / fVar61 +
                     fVar60;
                local_68.Min.x =
                     (((pIVar22->IO).MousePos.x - fVar59) * (1.0 - fVar62) * fVar50) / fVar50 +
                     fVar59;
                SetWindowPos(pIVar29,&local_68.Min,0);
                IVar57.x = (float)(int)((pIVar29->Size).x * fVar62);
                IVar57.y = (float)(int)((pIVar29->Size).y * fVar62);
                pIVar29->Size = IVar57;
                IVar58.x = (float)(int)((pIVar29->SizeFull).x * fVar62);
                IVar58.y = (float)(int)(fVar62 * (pIVar29->SizeFull).y);
                pIVar29->SizeFull = IVar58;
              }
              goto LAB_00127f44;
            }
            if ((pIVar22->IO).KeyShift == false) {
              fVar62 = fVar50;
            }
          }
          if (((fVar62 != 0.0) || (NAN(fVar62))) && ((pIVar22->IO).KeyCtrl == false)) {
            if (GImGui->WheelingWindow != pIVar29) {
              GImGui->WheelingWindow = pIVar29;
              pIVar23->WheelingWindowRefMousePos = (pIVar23->IO).MousePos;
              pIVar23->WheelingWindowTimer = 2.0;
            }
            uVar30 = pIVar29->Flags;
            while (((uVar30 >> 0x18 & 1) != 0 &&
                   (((uVar30 & 0x210) == 0x10 ||
                    ((fVar50 = (pIVar29->ScrollMax).y, fVar50 == 0.0 && (!NAN(fVar50)))))))) {
              pIVar29 = pIVar29->ParentWindow;
              uVar30 = pIVar29->Flags;
            }
            if ((uVar30 & 0x210) == 0) {
              fVar50 = ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) * 0.67;
              fVar61 = pIVar23->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
              if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
                fVar61 = fVar61 * pIVar29->ParentWindow->FontWindowScale;
              }
              fVar59 = fVar61 * 5.0;
              if (fVar50 <= fVar61 * 5.0) {
                fVar59 = fVar50;
              }
              (pIVar29->ScrollTarget).y = (pIVar29->Scroll).y - fVar62 * (float)(int)fVar59;
              (pIVar29->ScrollTargetCenterRatio).y = 0.0;
              (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
            }
          }
          pIVar23 = GImGui;
          fVar50 = (pIVar22->IO).MouseWheelH;
          if (((fVar50 == 0.0) && (!NAN(fVar50))) || ((pIVar22->IO).KeyShift == true)) {
            fVar62 = (pIVar22->IO).MouseWheel;
            if ((fVar62 != 0.0) || (NAN(fVar62))) {
              fVar50 = 0.0;
              if ((pIVar22->IO).KeyShift == true) {
                fVar50 = fVar62;
              }
            }
            else {
              fVar50 = 0.0;
            }
          }
          if (((fVar50 != 0.0) || (NAN(fVar50))) && ((pIVar22->IO).KeyCtrl == false)) {
            if (GImGui->WheelingWindow != pIVar29) {
              GImGui->WheelingWindow = pIVar29;
              pIVar23->WheelingWindowRefMousePos = (pIVar23->IO).MousePos;
              pIVar23->WheelingWindowTimer = 2.0;
            }
            while ((uVar30 = pIVar29->Flags, (uVar30 >> 0x18 & 1) != 0 &&
                   (((uVar30 & 0x210) == 0x10 ||
                    ((fVar62 = (pIVar29->ScrollMax).x, fVar62 == 0.0 && (!NAN(fVar62)))))))) {
              pIVar29 = pIVar29->ParentWindow;
            }
            if ((uVar30 & 0x210) == 0) {
              fVar62 = ((pIVar29->InnerRect).Max.x - (pIVar29->InnerRect).Min.x) * 0.67;
              fVar61 = pIVar23->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
              if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
                fVar61 = fVar61 * pIVar29->ParentWindow->FontWindowScale;
              }
              fVar59 = fVar61 + fVar61;
              if (fVar62 <= fVar61 + fVar61) {
                fVar59 = fVar62;
              }
              (pIVar29->ScrollTarget).x = (pIVar29->Scroll).x - fVar50 * (float)(int)fVar59;
              (pIVar29->ScrollTargetCenterRatio).x = 0.0;
              (pIVar29->ScrollTargetEdgeSnapDist).x = 0.0;
            }
          }
        }
      }
LAB_00127f44:
      pIVar22 = GImGui;
      pIVar29 = GImGui->NavWindow;
      if (((pIVar29 == (ImGuiWindow *)0x0) || (pIVar29->Active != true)) ||
         (((pIVar29->Flags & 0x40000) != 0 ||
          (((GImGui->IO).KeyCtrl != false || (iVar34 = (GImGui->IO).KeyMap[0], iVar34 < 0)))))) {
        bVar24 = false;
      }
      else {
        bVar24 = IsKeyPressed(iVar34,true);
      }
      pIVar22->FocusTabPressed = bVar24;
      if ((bVar24 != false) && (pIVar22->ActiveId == 0)) {
        pIVar22->FocusRequestNextWindow = pIVar22->NavWindow;
        pIVar22->FocusRequestNextCounterRegular = 0x7fffffff;
        if ((pIVar22->NavId == 0) || (pIVar22->NavIdTabCounter == 0x7fffffff)) {
          iVar34 = -(uint)(pIVar22->IO).KeyShift;
        }
        else {
          iVar34 = pIVar22->NavIdTabCounter + (-(uint)(pIVar22->IO).KeyShift | 1) + 1;
        }
        pIVar22->FocusRequestNextCounterTabStop = iVar34;
      }
      pIVar22->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
      pIVar22->FocusRequestCurrCounterRegular = 0x7fffffff;
      pIVar22->FocusRequestCurrCounterTabStop = 0x7fffffff;
      pIVar29 = pIVar22->FocusRequestNextWindow;
      if (pIVar29 != (ImGuiWindow *)0x0) {
        pIVar22->FocusRequestCurrWindow = pIVar29;
        if ((pIVar22->FocusRequestNextCounterRegular != 0x7fffffff) &&
           (iVar34 = (pIVar29->DC).FocusCounterRegular, iVar34 != -1)) {
          pIVar22->FocusRequestCurrCounterRegular =
               (pIVar22->FocusRequestNextCounterRegular + iVar34 + 1) % (iVar34 + 1);
        }
        if ((pIVar22->FocusRequestNextCounterTabStop != 0x7fffffff) &&
           (iVar34 = (pIVar29->DC).FocusCounterTabStop, iVar34 != -1)) {
          pIVar22->FocusRequestCurrCounterTabStop =
               (pIVar22->FocusRequestNextCounterTabStop + iVar34 + 1) % (iVar34 + 1);
        }
        pIVar22->FocusRequestNextWindow = (ImGuiWindow *)0x0;
        pIVar22->FocusRequestNextCounterRegular = 0x7fffffff;
        pIVar22->FocusRequestNextCounterTabStop = 0x7fffffff;
      }
      pIVar22->NavIdTabCounter = 0x7fffffff;
      if ((ctx->WindowsFocusOrder).Size != (ctx->Windows).Size) {
        __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0xfea,"void ImGui::NewFrame()");
      }
      fVar50 = (ctx->IO).ConfigWindowsMemoryCompactTimer;
      if (0.0 <= fVar50) {
        fVar50 = (float)ctx->Time - fVar50;
      }
      else {
        fVar50 = 3.4028235e+38;
      }
      uVar30 = (ctx->Windows).Size;
      uVar35 = (ulong)uVar30;
      if (uVar30 != 0) {
        uVar46 = 0;
        do {
          if ((long)(int)uVar35 <= (long)uVar46) goto LAB_001287e2;
          pIVar29 = (ctx->Windows).Data[uVar46];
          bVar24 = pIVar29->Active;
          pIVar29->WasActive = bVar24;
          pIVar29->BeginCount = 0;
          pIVar29->Active = false;
          pIVar29->WriteAccessed = false;
          if (((bVar24 == false) && (pIVar29->MemoryCompacted == false)) &&
             (pIVar29->LastTimeActive <= fVar50 && fVar50 != pIVar29->LastTimeActive)) {
            GcCompactTransientWindowBuffers(pIVar29);
          }
          uVar46 = uVar46 + 1;
          uVar35 = (ulong)(uint)(ctx->Windows).Size;
        } while (uVar46 != uVar35);
      }
      if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      iVar34 = (ctx->CurrentWindowStack).Capacity;
      if (iVar34 < 0) {
        uVar30 = iVar34 / 2 + iVar34;
        uVar35 = 0;
        if (0 < (int)uVar30) {
          uVar35 = (ulong)uVar30;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar35 * 8,GImAllocatorUserData);
        ppIVar16 = (ctx->CurrentWindowStack).Data;
        if (ppIVar16 != (ImGuiWindow **)0x0) {
          memcpy(__dest_00,ppIVar16,(long)(ctx->CurrentWindowStack).Size << 3);
          ppIVar16 = (ctx->CurrentWindowStack).Data;
          if ((ppIVar16 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar16,GImAllocatorUserData);
        }
        (ctx->CurrentWindowStack).Data = __dest_00;
        (ctx->CurrentWindowStack).Capacity = (int)uVar35;
      }
      (ctx->CurrentWindowStack).Size = 0;
      iVar34 = (ctx->BeginPopupStack).Capacity;
      if (iVar34 < 0) {
        uVar30 = iVar34 / 2 + iVar34;
        uVar35 = 0;
        if (0 < (int)uVar30) {
          uVar35 = (ulong)uVar30;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar35 * 0x30,GImAllocatorUserData);
        pIVar20 = (ctx->BeginPopupStack).Data;
        if (pIVar20 != (ImGuiPopupData *)0x0) {
          memcpy(__dest_01,pIVar20,(long)(ctx->BeginPopupStack).Size * 0x30);
          pIVar20 = (ctx->BeginPopupStack).Data;
          if ((pIVar20 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
        }
        (ctx->BeginPopupStack).Data = __dest_01;
        (ctx->BeginPopupStack).Capacity = (int)uVar35;
      }
      (ctx->BeginPopupStack).Size = 0;
      ClosePopupsOverWindow(ctx->NavWindow,false);
      DockContextUpdateDocking(ctx);
      pIVar22 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar22->DebugItemPickerActive == true) {
        uVar30 = pIVar22->HoveredIdPreviousFrame;
        pIVar22->MouseCursor = 7;
        iVar34 = (pIVar22->IO).KeyMap[0xe];
        if ((-1 < iVar34) && (bVar24 = IsKeyPressed(iVar34,true), bVar24)) {
          pIVar22->DebugItemPickerActive = false;
        }
        pIVar23 = GImGui;
        if (uVar30 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
          pIVar22->DebugItemPickerBreakId = uVar30;
          pIVar22->DebugItemPickerActive = false;
        }
        pIVar5 = &pIVar23->NextWindowData;
        *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
        (pIVar23->NextWindowData).BgAlphaVal = 0.6;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X",(ulong)uVar30);
        Text("Press ESC to abort picking.");
        TextColored((GImGui->Style).Colors + (uVar30 == 0),"Click to break in debugger!");
        EndTooltip();
      }
      ctx->WithinFrameScopeWithImplicitWindow = true;
      pIVar22 = GImGui;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
      (pIVar22->NextWindowData).SizeVal.x = 400.0;
      (pIVar22->NextWindowData).SizeVal.y = 400.0;
      (pIVar22->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (ctx->CurrentWindow->IsFallbackWindow == false) {
        __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x100f,"void ImGui::NewFrame()");
      }
      if (0 < (ctx->Hooks).Size) {
        lVar42 = 0;
        lVar43 = 0;
        do {
          pIVar11 = (ctx->Hooks).Data;
          if (*(int *)(pIVar11 + lVar42) == 1) {
            (**(code **)(pIVar11 + lVar42 + 8))(ctx,pIVar11 + lVar42);
          }
          lVar43 = lVar43 + 1;
          lVar42 = lVar42 + 0x18;
        } while (lVar43 < (ctx->Hooks).Size);
      }
      return;
    }
  }
  else {
    if ((~(pIVar22->IO).BackendFlags & 0x1400U) != 0) {
      (pIVar22->IO).ConfigFlags = uVar30 & 0xfffffbff;
LAB_0012517e:
      lVar42 = (long)(pIVar22->PlatformIO).Monitors.Size;
      if (0 < lVar42) {
        pIVar13 = (pIVar22->PlatformIO).Monitors.Data;
        lVar43 = 0;
        do {
          fVar50 = *(float *)((long)&(pIVar13->MainSize).x + lVar43);
          if ((fVar50 <= 0.0) ||
             (fVar62 = *(float *)((long)&(pIVar13->MainSize).y + lVar43), fVar62 <= 0.0)) {
            __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x1dc2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          fVar61 = *(float *)((long)&(pIVar13->MainPos).x + lVar43);
          fVar59 = *(float *)((long)&(pIVar13->WorkPos).x + lVar43);
          if (fVar59 < fVar61) {
LAB_00128856:
            __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x1dc3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          fVar60 = *(float *)((long)&(pIVar13->MainPos).y + lVar43);
          fVar52 = *(float *)((long)&(pIVar13->WorkPos).y + lVar43);
          if (((fVar52 < fVar60) ||
              (fVar50 + fVar61 < fVar59 + *(float *)((long)&(pIVar13->WorkSize).x + lVar43))) ||
             (fVar62 + fVar60 < fVar52 + *(float *)((long)&(pIVar13->WorkSize).y + lVar43)))
          goto LAB_00128856;
          fVar50 = *(float *)((long)&pIVar13->DpiScale + lVar43);
          if ((fVar50 == 0.0) && (!NAN(fVar50))) {
            __assert_fail("mon.DpiScale != 0.0f",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x1dc4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          lVar43 = lVar43 + 0x24;
        } while (lVar42 * 0x24 != lVar43);
      }
      goto LAB_0012522d;
    }
    if ((iVar34 != 0) && (iVar34 != pIVar22->FrameCountPlatformEnded)) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dac,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar22->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dad,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar22->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dae,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar22->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1daf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar22->PlatformIO).Platform_SetWindowPos == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
      __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar22->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar22->PlatformIO).Platform_SetWindowSize == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)
    {
      __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar22->PlatformIO).Monitors.Size < 1) {
      __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if (0 < (pIVar22->Viewports).Size) {
      pIVar44 = *(pIVar22->Viewports).Data;
      if (((pIVar44->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
         ((pIVar44->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
        __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x1db4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      if ((((uVar30 & 0x40) != 0) && ((pIVar22->IO).ConfigDockingTransparentPayload != false)) &&
         ((pIVar22->PlatformIO).Platform_SetWindowAlpha == (_func_void_ImGuiViewport_ptr_float *)0x0
         )) {
        __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x1db6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      goto LAB_0012517e;
    }
  }
LAB_00128818:
  pcVar32 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_0012882d:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5c2,pcVar32);
LAB_001287e2:
  pcVar32 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
  goto LAB_0012882d;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}